

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O1

int bcf_unpack(bcf1_t *b,int which)

{
  char *pcVar1;
  uint *puVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  uint8_t *ptr;
  char *pcVar6;
  undefined1 auVar7 [8];
  size_t __ptr;
  uint8_t *ptr_00;
  ulong uVar8;
  void *pvVar9;
  ulong uVar10;
  char **ppcVar11;
  int *piVar12;
  bcf_info_t *pbVar13;
  long lVar14;
  bcf_fmt_t *pbVar15;
  int iVar16;
  long lVar17;
  uint8_t **ppuVar18;
  size_t __size;
  byte *pbVar19;
  byte *pbVar20;
  uint uVar21;
  int *piVar22;
  uint8_t *ptr_start;
  uint uVar23;
  byte *pbVar24;
  undefined8 uStack_60;
  uint8_t *local_58;
  uint local_50;
  uint local_4c;
  undefined1 local_48 [8];
  kstring_t tmp;
  
  if ((b->shared).l == 0) {
    return 0;
  }
  uVar23 = 7;
  if ((which & 4U) == 0) {
    uVar23 = (uint)which >> 1 & 1;
  }
  uVar23 = uVar23 | which;
  ppuVar18 = &local_58;
  if (((uVar23 & 1) == 0) || (ppuVar18 = &local_58, (b->unpacked & 1) != 0)) goto LAB_0011f0f0;
  ptr = (uint8_t *)(b->shared).s;
  local_48 = (undefined1  [8])0x0;
  tmp.m = (size_t)(b->d).id;
  tmp.l = (size_t)(b->d).m_id;
  uStack_60 = 0x11eed3;
  local_50 = uVar23;
  local_4c = which;
  ptr_00 = bcf_fmt_sized_array((kstring_t *)local_48,ptr);
  b->unpack_size[0] = (int)ptr_00 - (int)ptr;
  uVar8 = (long)local_48 + 1;
  pvVar9 = (void *)tmp.m;
  if (uVar8 < tmp.l) {
LAB_0011ef36:
    tmp.m = (size_t)pvVar9;
    *(undefined1 *)(tmp.m + (long)local_48) = 0;
    *(undefined1 *)(tmp.m + (long)local_48 + 1U) = 0;
  }
  else {
    uVar8 = uVar8 >> 1 | uVar8;
    uVar8 = uVar8 >> 2 | uVar8;
    uVar8 = uVar8 >> 4 | uVar8;
    uVar8 = uVar8 >> 8 | uVar8;
    tmp.l = (uVar8 >> 0x10 | uVar8) + 1;
    uStack_60 = 0x11ef2d;
    pvVar9 = realloc((void *)tmp.m,tmp.l);
    if (pvVar9 != (void *)0x0) goto LAB_0011ef36;
  }
  (b->d).id = (char *)tmp.m;
  (b->d).m_id = (int)tmp.l;
  local_48 = (undefined1  [8])0x0;
  tmp.m = (size_t)(b->d).als;
  tmp.l = (long)(b->d).m_als;
  uVar23 = *(uint *)&b->field_0x10 >> 0x10;
  lVar14 = -(ulong)(uVar23 * 4 + 0xf & 0xfffffff0);
  ppuVar18 = (uint8_t **)((long)&local_58 + lVar14);
  local_58 = ptr_00;
  if (0xffff < *(uint *)&b->field_0x10) {
    uVar8 = 0;
    do {
      *(undefined4 *)((long)ppuVar18 + uVar8 * 4) = local_48._0_4_;
      *(undefined8 *)((long)&uStack_60 + lVar14) = 0x11efc7;
      ptr_00 = bcf_fmt_sized_array((kstring_t *)local_48,ptr_00);
      __ptr = tmp.m;
      uVar10 = (long)local_48 + 1;
      if (uVar10 < tmp.l) {
LAB_0011f021:
        auVar7 = local_48;
        local_48 = (undefined1  [8])((long)local_48 + 1);
        *(undefined1 *)(tmp.m + (long)auVar7) = 0;
        *(undefined1 *)(tmp.m + (long)local_48) = 0;
      }
      else {
        uVar10 = uVar10 >> 1 | uVar10;
        uVar10 = uVar10 >> 2 | uVar10;
        uVar10 = uVar10 >> 4 | uVar10;
        uVar10 = uVar10 >> 8 | uVar10;
        __size = (uVar10 >> 0x10 | uVar10) + 1;
        tmp.l = __size;
        *(undefined8 *)((long)&uStack_60 + lVar14) = 0x11f018;
        pvVar9 = realloc((void *)__ptr,__size);
        if (pvVar9 != (void *)0x0) {
          tmp.m = (size_t)pvVar9;
          goto LAB_0011f021;
        }
      }
      uVar8 = uVar8 + 1;
      uVar23 = *(uint *)&b->field_0x10 >> 0x10;
    } while (uVar8 < uVar23);
  }
  b->unpack_size[1] = (int)ptr_00 - (int)local_58;
  (b->d).als = (char *)tmp.m;
  (b->d).m_als = (int)tmp.l;
  if ((b->d).m_allele < (int)uVar23) {
    uVar23 = (int)(uVar23 - 1) >> 1 | uVar23 - 1;
    uVar23 = (int)uVar23 >> 2 | uVar23;
    uVar23 = (int)uVar23 >> 4 | uVar23;
    uVar23 = (int)uVar23 >> 8 | uVar23;
    uVar23 = (int)uVar23 >> 0x10 | uVar23;
    (b->d).m_allele = uVar23 + 1;
    ppcVar11 = (b->d).allele;
    *(undefined8 *)((long)&uStack_60 + lVar14) = 0x11f0b2;
    ppcVar11 = (char **)realloc(ppcVar11,(long)(int)uVar23 * 8 + 8);
    (b->d).allele = ppcVar11;
  }
  if (*(short *)&b->field_0x12 != 0) {
    uVar8 = 0;
    do {
      (b->d).allele[uVar8] = (b->d).als + *(int *)((long)ppuVar18 + uVar8 * 4);
      uVar8 = uVar8 + 1;
    } while (uVar8 < *(ushort *)&b->field_0x12);
  }
  *(byte *)&b->unpacked = (byte)b->unpacked | 1;
  which = local_4c;
  uVar23 = local_50;
LAB_0011f0f0:
  if (((uVar23 & 2) != 0) && ((b->unpacked & 2) == 0)) {
    pcVar6 = (b->shared).s;
    pcVar1 = pcVar6 + (long)b->unpack_size[1] + (long)b->unpack_size[0];
    bVar3 = pcVar6[(long)b->unpack_size[1] + (long)b->unpack_size[0]];
    local_4c = which;
    if (bVar3 < 0x10) {
      piVar22 = (int *)(pcVar1 + 1);
      (b->d).n_flt = 0;
    }
    else {
      if (bVar3 < 0xf0) {
        piVar22 = (int *)(pcVar1 + 1);
        uVar21 = (uint)(bVar3 >> 4);
      }
      else if ((pcVar1[1] & 0xfU) == 2) {
        piVar22 = (int *)(pcVar1 + 4);
        uVar21 = (uint)*(short *)(pcVar1 + 2);
      }
      else if ((pcVar1[1] & 0xfU) == 1) {
        piVar22 = (int *)(pcVar1 + 3);
        uVar21 = (uint)pcVar1[2];
      }
      else {
        piVar22 = (int *)(pcVar1 + 6);
        uVar21 = *(uint *)(pcVar1 + 2);
      }
      (b->d).n_flt = uVar21;
      if ((b->d).m_flt < (int)uVar21) {
        uVar21 = (int)(uVar21 - 1) >> 1 | uVar21 - 1;
        uVar21 = (int)uVar21 >> 2 | uVar21;
        uVar21 = (int)uVar21 >> 4 | uVar21;
        uVar21 = (int)uVar21 >> 8 | uVar21;
        uVar21 = (int)uVar21 >> 0x10 | uVar21;
        (b->d).m_flt = uVar21 + 1;
        piVar12 = (b->d).flt;
        *(undefined8 *)((long)ppuVar18 + -8) = 0x11f1c4;
        piVar12 = (int *)realloc(piVar12,(long)(int)uVar21 * 4 + 4);
        (b->d).flt = piVar12;
      }
      if (0 < (b->d).n_flt) {
        piVar12 = (b->d).flt;
        lVar14 = 0;
        do {
          if ((bVar3 & 0xf) == 2) {
            iVar16 = (int)(short)*piVar22;
            piVar22 = (int *)((long)piVar22 + 2);
          }
          else if ((bVar3 & 0xf) == 1) {
            iVar16 = (int)(char)*piVar22;
            piVar22 = (int *)((long)piVar22 + 1);
          }
          else {
            iVar16 = *piVar22;
            piVar22 = piVar22 + 1;
          }
          piVar12[lVar14] = iVar16;
          lVar14 = lVar14 + 1;
        } while (lVar14 < (b->d).n_flt);
      }
    }
    b->unpack_size[2] = (int)piVar22 - (int)pcVar1;
    *(byte *)&b->unpacked = (byte)b->unpacked | 2;
    which = local_4c;
  }
  if (((uVar23 & 4) != 0) && ((b->unpacked & 4) == 0)) {
    iVar16 = b->unpack_size[0];
    pcVar1 = (b->shared).s;
    iVar4 = b->unpack_size[1];
    iVar5 = b->unpack_size[2];
    if ((b->d).m_info < (int)(uint)*(ushort *)&b->field_0x10) {
      uVar23 = *(ushort *)&b->field_0x10 - 1;
      uVar23 = (int)uVar23 >> 1 | uVar23;
      uVar23 = (int)uVar23 >> 2 | uVar23;
      uVar23 = (int)uVar23 >> 4 | uVar23;
      uVar23 = (int)uVar23 >> 8 | uVar23;
      uVar23 = (int)uVar23 >> 0x10 | uVar23;
      (b->d).m_info = uVar23 + 1;
      pbVar13 = (b->d).info;
      *(undefined8 *)((long)ppuVar18 + -8) = 0x11f2a4;
      pbVar13 = (bcf_info_t *)realloc(pbVar13,(long)(int)uVar23 * 0x20 + 0x20);
      (b->d).info = pbVar13;
    }
    if (0 < (b->d).m_info) {
      lVar14 = 0x1c;
      lVar17 = 0;
      do {
        puVar2 = (uint *)((long)&((b->d).info)->key + lVar14);
        *puVar2 = *puVar2 & 0x7fffffff;
        lVar17 = lVar17 + 1;
        lVar14 = lVar14 + 0x20;
      } while (lVar17 < (b->d).m_info);
    }
    if (*(short *)&b->field_0x10 != 0) {
      pbVar24 = (byte *)(pcVar1 + (long)iVar4 + (long)iVar5 + (long)iVar16);
      lVar14 = 0x1c;
      uVar8 = 0;
      do {
        if ((*pbVar24 & 0xf) == 2) {
          pbVar20 = pbVar24 + 3;
          iVar16 = (int)*(short *)(pbVar24 + 1);
        }
        else if ((*pbVar24 & 0xf) == 1) {
          pbVar20 = pbVar24 + 2;
          iVar16 = (int)(char)pbVar24[1];
        }
        else {
          pbVar20 = pbVar24 + 5;
          iVar16 = *(int *)(pbVar24 + 1);
        }
        pbVar13 = (b->d).info;
        *(int *)((long)pbVar13 + lVar14 + -0x1c) = iVar16;
        uVar23 = *pbVar20 & 0xf;
        *(uint *)((long)pbVar13 + lVar14 + -0x18) = uVar23;
        if (*pbVar20 < 0xf0) {
          pbVar19 = pbVar20 + 1;
          uVar21 = (uint)(*pbVar20 >> 4);
        }
        else if ((pbVar20[1] & 0xf) == 2) {
          uVar21 = (uint)*(short *)(pbVar20 + 2);
          pbVar19 = pbVar20 + 4;
        }
        else if ((pbVar20[1] & 0xf) == 1) {
          uVar21 = (uint)(char)pbVar20[2];
          pbVar19 = pbVar20 + 3;
        }
        else {
          uVar21 = *(uint *)(pbVar20 + 2);
          pbVar19 = pbVar20 + 6;
        }
        *(uint *)((long)pbVar13 + lVar14 + -0x14) = uVar21;
        *(byte **)((long)pbVar13 + lVar14 + -0xc) = pbVar19;
        *(uint *)((long)&pbVar13->key + lVar14) = (int)pbVar19 - (int)pbVar24 & 0x7fffffff;
        *(undefined4 *)((long)pbVar13 + lVar14 + -0x10) = 0;
        if (uVar21 != 1) goto switchD_0011f3ca_caseD_4;
        switch(uVar23) {
        case 1:
        case 7:
          iVar16 = (int)(char)*pbVar19;
          break;
        case 2:
          iVar16 = (int)*(short *)pbVar19;
          break;
        case 3:
          iVar16 = *(int *)pbVar19;
          break;
        default:
          goto switchD_0011f3ca_caseD_4;
        case 5:
          *(undefined4 *)((long)pbVar13 + lVar14 + -0x10) = *(undefined4 *)pbVar19;
          goto switchD_0011f3ca_caseD_4;
        }
        *(int *)((long)pbVar13 + lVar14 + -0x10) = iVar16;
switchD_0011f3ca_caseD_4:
        iVar16 = uVar21 << (bcf_type_shift[uVar23] & 0x1f);
        pbVar24 = pbVar19 + iVar16;
        *(int *)((long)pbVar13 + lVar14 + -4) = iVar16;
        uVar8 = uVar8 + 1;
        lVar14 = lVar14 + 0x20;
      } while (uVar8 < *(ushort *)&b->field_0x10);
    }
    *(byte *)&b->unpacked = (byte)b->unpacked | 4;
  }
  if ((((which & 8U) != 0) && (*(ulong *)&b->field_0x10 >> 0x28 != 0)) && ((b->unpacked & 8) == 0))
  {
    pbVar24 = (byte *)(b->indiv).s;
    uVar23 = (uint)(*(ulong *)&b->field_0x10 >> 0x20) & 0xff;
    if ((b->d).m_fmt < (int)uVar23) {
      uVar23 = uVar23 - 1;
      uVar23 = (int)uVar23 >> 1 | uVar23;
      uVar23 = (int)uVar23 >> 2 | uVar23;
      uVar23 = (int)uVar23 >> 4 | uVar23;
      uVar23 = (int)uVar23 >> 8 | uVar23;
      uVar23 = (int)uVar23 >> 0x10 | uVar23;
      (b->d).m_fmt = uVar23 + 1;
      pbVar15 = (b->d).fmt;
      *(undefined8 *)((long)ppuVar18 + -8) = 0x11f49b;
      pbVar15 = (bcf_fmt_t *)realloc(pbVar15,(long)(int)uVar23 * 0x20 + 0x20);
      (b->d).fmt = pbVar15;
    }
    if (0 < (b->d).m_fmt) {
      lVar14 = 0x1c;
      lVar17 = 0;
      do {
        puVar2 = (uint *)((long)&((b->d).fmt)->id + lVar14);
        *puVar2 = *puVar2 & 0x7fffffff;
        lVar17 = lVar17 + 1;
        lVar14 = lVar14 + 0x20;
      } while (lVar17 < (b->d).m_fmt);
    }
    uVar8 = *(ulong *)&b->field_0x10;
    if ((char)(uVar8 >> 0x20) != '\0') {
      lVar14 = 0x1c;
      uVar10 = 0;
      do {
        if ((*pbVar24 & 0xf) == 2) {
          pbVar20 = pbVar24 + 3;
          iVar16 = (int)*(short *)(pbVar24 + 1);
        }
        else if ((*pbVar24 & 0xf) == 1) {
          pbVar20 = pbVar24 + 2;
          iVar16 = (int)(char)pbVar24[1];
        }
        else {
          pbVar20 = pbVar24 + 5;
          iVar16 = *(int *)(pbVar24 + 1);
        }
        pbVar15 = (b->d).fmt;
        *(int *)((long)pbVar15 + lVar14 + -0x1c) = iVar16;
        bVar3 = *pbVar20;
        *(uint *)((long)pbVar15 + lVar14 + -0x10) = bVar3 & 0xf;
        if (*pbVar20 < 0xf0) {
          pbVar19 = pbVar20 + 1;
          uVar23 = (uint)(*pbVar20 >> 4);
        }
        else if ((pbVar20[1] & 0xf) == 2) {
          uVar23 = (uint)*(short *)(pbVar20 + 2);
          pbVar19 = pbVar20 + 4;
        }
        else if ((pbVar20[1] & 0xf) == 1) {
          uVar23 = (uint)(char)pbVar20[2];
          pbVar19 = pbVar20 + 3;
        }
        else {
          uVar23 = *(uint *)(pbVar20 + 2);
          pbVar19 = pbVar20 + 6;
        }
        *(uint *)((long)pbVar15 + lVar14 + -0x18) = uVar23;
        iVar16 = uVar23 << (bcf_type_shift[bVar3 & 0xf] & 0x1f);
        *(int *)((long)pbVar15 + lVar14 + -0x14) = iVar16;
        *(byte **)((long)pbVar15 + lVar14 + -0xc) = pbVar19;
        *(uint *)((long)&pbVar15->id + lVar14) = (int)pbVar19 - (int)pbVar24 & 0x7fffffff;
        iVar16 = iVar16 * (uint)(uVar8 >> 0x28);
        pbVar24 = pbVar19 + iVar16;
        *(int *)((long)pbVar15 + lVar14 + -4) = iVar16;
        uVar10 = uVar10 + 1;
        uVar8 = *(ulong *)&b->field_0x10;
        lVar14 = lVar14 + 0x20;
      } while (uVar10 < (uVar8 >> 0x20 & 0xff));
    }
    *(byte *)&b->unpacked = (byte)b->unpacked | 8;
  }
  return 0;
}

Assistant:

int bcf_unpack(bcf1_t *b, int which)
{
    if ( !b->shared.l ) return 0; // Building a new BCF record from scratch
    uint8_t *ptr = (uint8_t*)b->shared.s, *ptr_ori;
    int *offset, i;
    bcf_dec_t *d = &b->d;
    if (which & BCF_UN_FLT) which |= BCF_UN_STR;
    if (which & BCF_UN_INFO) which |= BCF_UN_SHR;
    if ((which&BCF_UN_STR) && !(b->unpacked&BCF_UN_STR))
    {
        kstring_t tmp;

        // ID
        tmp.l = 0; tmp.s = d->id; tmp.m = d->m_id;
        ptr_ori = ptr;
        ptr = bcf_fmt_sized_array(&tmp, ptr);
        b->unpack_size[0] = ptr - ptr_ori;
        kputc('\0', &tmp);
        d->id = tmp.s; d->m_id = tmp.m;

        // REF and ALT are in a single block (d->als) and d->alleles are pointers into this block
        tmp.l = 0; tmp.s = d->als; tmp.m = d->m_als;
        offset = (int*)alloca(b->n_allele * sizeof(int));
        ptr_ori = ptr;
        for (i = 0; i < b->n_allele; ++i) {
            offset[i] = tmp.l;
            ptr = bcf_fmt_sized_array(&tmp, ptr);
            kputc('\0', &tmp);
        }
        b->unpack_size[1] = ptr - ptr_ori;
        d->als = tmp.s; d->m_als = tmp.m;

        hts_expand(char*, b->n_allele, d->m_allele, d->allele); // NM: hts_expand() is a macro
        for (i = 0; i < b->n_allele; ++i)
            d->allele[i] = d->als + offset[i];
        b->unpacked |= BCF_UN_STR;
    }
    if ((which&BCF_UN_FLT) && !(b->unpacked&BCF_UN_FLT)) { // FILTER
        ptr = (uint8_t*)b->shared.s + b->unpack_size[0] + b->unpack_size[1];
        ptr_ori = ptr;
        if (*ptr>>4) {
            int type;
            d->n_flt = bcf_dec_size(ptr, &ptr, &type);
            hts_expand(int, d->n_flt, d->m_flt, d->flt);
            for (i = 0; i < d->n_flt; ++i)
                d->flt[i] = bcf_dec_int1(ptr, type, &ptr);
        } else ++ptr, d->n_flt = 0;
        b->unpack_size[2] = ptr - ptr_ori;
        b->unpacked |= BCF_UN_FLT;
    }
    if ((which&BCF_UN_INFO) && !(b->unpacked&BCF_UN_INFO)) { // INFO
        ptr = (uint8_t*)b->shared.s + b->unpack_size[0] + b->unpack_size[1] + b->unpack_size[2];
        hts_expand(bcf_info_t, b->n_info, d->m_info, d->info);
        for (i = 0; i < d->m_info; ++i) d->info[i].vptr_free = 0;
        for (i = 0; i < b->n_info; ++i)
            ptr = bcf_unpack_info_core1(ptr, &d->info[i]);
        b->unpacked |= BCF_UN_INFO;
    }
    if ((which&BCF_UN_FMT) && b->n_sample && !(b->unpacked&BCF_UN_FMT)) { // FORMAT
        ptr = (uint8_t*)b->indiv.s;
        hts_expand(bcf_fmt_t, b->n_fmt, d->m_fmt, d->fmt);
        for (i = 0; i < d->m_fmt; ++i) d->fmt[i].p_free = 0;
        for (i = 0; i < b->n_fmt; ++i)
            ptr = bcf_unpack_fmt_core1(ptr, b->n_sample, &d->fmt[i]);
        b->unpacked |= BCF_UN_FMT;
    }
    return 0;
}